

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  RayQueryContext *pRVar8;
  long lVar9;
  code *pcVar10;
  undefined4 uVar11;
  ulong uVar12;
  size_t i_1;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  RayQueryContext *pRVar17;
  NodeRef *pNVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  RayQueryContext *pRVar20;
  float fVar21;
  float fVar30;
  float fVar31;
  vint4 bi;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  float fVar34;
  float fVar39;
  float fVar40;
  vint4 bi_1;
  float fVar41;
  undefined1 auVar35 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  vint4 ai;
  float fVar46;
  undefined1 auVar43 [16];
  float fVar47;
  float fVar50;
  float fVar51;
  vint4 ai_1;
  undefined1 auVar48 [16];
  float fVar52;
  undefined1 auVar49 [16];
  float fVar53;
  float fVar56;
  float fVar57;
  vint4 ai_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  uint uVar60;
  float fVar61;
  uint uVar62;
  uint uVar63;
  float fVar64;
  uint uVar65;
  uint uVar66;
  vint4 bi_2;
  float fVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 bi_3;
  float fVar76;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar77;
  float fVar78;
  uint uVar79;
  uint uVar80;
  vint4 ai_2;
  float fVar81;
  uint uVar82;
  float fVar84;
  undefined1 auVar83 [16];
  float fVar85;
  float fVar86;
  float fVar89;
  float fVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  undefined1 auVar93 [16];
  float fVar96;
  float fVar97;
  float fVar99;
  float fVar100;
  undefined1 in_XMM12 [16];
  undefined1 auVar98 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 in_XMM13 [16];
  float fVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  undefined1 auVar109 [16];
  vint4 bi_8;
  undefined1 local_17b8 [16];
  vint<4> *local_17a0;
  undefined8 local_1798;
  undefined4 local_1790;
  undefined8 local_1788;
  Intersectors *local_1780;
  undefined4 local_1778;
  uint local_1774;
  long local_1770;
  undefined8 local_1768;
  long local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  RayQueryContext *pRVar7;
  
  stack_node[1].ptr = *(size_t *)((valid_i->field_0).v[0] + 0x70);
  if (stack_node[1].ptr != 8) {
    if ((*(long *)(ray + 8) != 0) && ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) != 0)) {
      intersectCoherent((vint<4> *)this,(Intersectors *)valid_i,(RayHitK<4> *)This,
                        (RayQueryContext *)ray);
      return;
    }
    auVar55._8_4_ = 0xffffffff;
    auVar55._0_8_ = 0xffffffffffffffff;
    auVar55._12_4_ = 0xffffffff;
    auVar48._0_4_ = -(uint)(*(int *)this == -1);
    auVar48._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar48._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar48._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar13 = movmskps((int)valid_i,auVar48);
    uVar14 = CONCAT44((int)((ulong)valid_i >> 0x20),iVar13);
    if (iVar13 != 0) {
      auVar26._0_8_ = (This->intersector4).intersect;
      auVar26._8_8_ = (This->intersector4).occluded;
      fVar73 = (float)((ulong)auVar26._0_8_ >> 0x20);
      fVar76 = (float)((ulong)auVar26._8_8_ >> 0x20);
      fVar59 = (float)DAT_01f4bd50;
      fVar61 = DAT_01f4bd50._4_4_;
      fVar64 = DAT_01f4bd50._8_4_;
      fVar67 = DAT_01f4bd50._12_4_;
      auVar83._4_4_ = -(uint)(ABS(fVar73) < fVar61);
      auVar83._0_4_ = -(uint)(ABS((float)auVar26._0_8_) < fVar59);
      auVar83._8_4_ = -(uint)(ABS((float)auVar26._8_8_) < fVar64);
      auVar83._12_4_ = -(uint)(ABS(fVar76) < fVar67);
      auVar83 = blendvps(auVar26,_DAT_01f4bd50,auVar83);
      auVar2 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar93._4_4_ = -(uint)(ABS(auVar2._4_4_) < fVar61);
      auVar93._0_4_ = -(uint)(ABS(auVar2._0_4_) < fVar59);
      auVar93._8_4_ = -(uint)(ABS(auVar2._8_4_) < fVar64);
      auVar93._12_4_ = -(uint)(ABS(auVar2._12_4_) < fVar67);
      auVar87 = blendvps(auVar2,_DAT_01f4bd50,auVar93);
      auVar3._0_8_ = (This->intersector4_filter).occluded;
      auVar3._8_8_ = (This->intersector4_filter).name;
      fVar78 = (float)((ulong)auVar3._0_8_ >> 0x20);
      fVar81 = (float)((ulong)auVar3._8_8_ >> 0x20);
      auVar98._4_4_ = -(uint)(ABS(fVar78) < fVar61);
      auVar98._0_4_ = -(uint)(ABS((float)auVar3._0_8_) < fVar59);
      auVar98._8_4_ = -(uint)(ABS((float)auVar3._8_8_) < fVar64);
      auVar98._12_4_ = -(uint)(ABS(fVar81) < fVar67);
      auVar93 = blendvps(auVar3,_DAT_01f4bd50,auVar98);
      auVar98 = rcpps(in_XMM12,auVar83);
      fVar97 = auVar98._0_4_;
      fVar99 = auVar98._4_4_;
      fVar100 = auVar98._8_4_;
      fVar101 = auVar98._12_4_;
      auVar98 = rcpps(in_XMM13,auVar87);
      fVar102 = auVar98._0_4_;
      auVar88._0_4_ = auVar87._0_4_ * fVar102;
      fVar103 = auVar98._4_4_;
      auVar88._4_4_ = auVar87._4_4_ * fVar103;
      fVar104 = auVar98._8_4_;
      auVar88._8_4_ = auVar87._8_4_ * fVar104;
      fVar105 = auVar98._12_4_;
      auVar88._12_4_ = auVar87._12_4_ * fVar105;
      auVar87 = rcpps(auVar88,auVar93);
      fVar86 = auVar87._0_4_;
      fVar89 = auVar87._4_4_;
      fVar90 = auVar87._8_4_;
      fVar91 = auVar87._12_4_;
      auVar71._0_8_ =
           CONCAT44(-(uint)(fVar73 < 0.0),-(uint)((float)auVar26._0_8_ < 0.0)) & 0x100000001;
      auVar71._8_4_ = -(uint)((float)auVar26._8_8_ < 0.0) & 1;
      auVar71._12_4_ = -(uint)(fVar76 < 0.0) & 1;
      auVar54._0_8_ =
           CONCAT44(-(uint)(auVar2._4_4_ < 0.0),-(uint)(auVar2._0_4_ < 0.0)) & 0x200000002;
      auVar54._8_4_ = -(uint)(auVar2._8_4_ < 0.0) & 2;
      auVar54._12_4_ = -(uint)(auVar2._12_4_ < 0.0) & 2;
      fVar92 = *(float *)&This->ptr;
      fVar94 = *(float *)((long)&This->ptr + 4);
      fVar95 = *(float *)&This->leafIntersector;
      fVar96 = *(float *)((long)&This->leafIntersector + 4);
      fVar73 = *(float *)&(This->collider).collide;
      fVar76 = *(float *)((long)&(This->collider).collide + 4);
      fVar84 = *(float *)&(This->collider).name;
      fVar85 = *(float *)((long)&(This->collider).name + 4);
      fVar59 = *(float *)&(This->intersector1).intersect;
      fVar61 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar64 = *(float *)&(This->intersector1).occluded;
      fVar67 = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar87._8_4_ = -(uint)((float)auVar3._8_8_ < 0.0) & 4;
      auVar87._0_8_ =
           CONCAT44(-(uint)(fVar78 < 0.0),-(uint)((float)auVar3._0_8_ < 0.0)) & 0x400000004;
      auVar87._12_4_ = -(uint)(fVar81 < 0.0) & 4;
      auVar2._0_8_ = (This->intersector1).pointQuery;
      auVar2._8_8_ = (This->intersector1).name;
      local_17b8 = auVar48 ^ auVar55 | auVar87 | auVar54 | auVar71;
      do {
        lVar15 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        iVar13 = *(int *)(local_17b8 + lVar15 * 4);
        auVar72._0_4_ = -(uint)(iVar13 == local_17b8._0_4_);
        auVar72._4_4_ = -(uint)(iVar13 == local_17b8._4_4_);
        auVar72._8_4_ = -(uint)(iVar13 == local_17b8._8_4_);
        auVar72._12_4_ = -(uint)(iVar13 == local_17b8._12_4_);
        uVar11 = movmskps((int)lVar15,auVar72);
        uVar12 = ~CONCAT44((int)((ulong)lVar15 >> 0x20),uVar11);
        auVar109._8_8_ = uVar12;
        auVar109._0_8_ = stack_node[1].ptr;
        uVar14 = uVar14 & uVar12;
      } while (uVar14 != 0);
      local_17b8._8_4_ = 0xffffffff;
      local_17b8._0_8_ = 0xffffffffffffffff;
      local_17b8._12_4_ = 0xffffffff;
      auVar32._0_4_ = -(uint)(*(int *)this == -1);
      auVar32._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar32._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar32._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      fVar97 = fVar97 + (1.0 - auVar83._0_4_ * fVar97) * fVar97;
      fVar99 = fVar99 + (1.0 - auVar83._4_4_ * fVar99) * fVar99;
      fVar100 = fVar100 + (1.0 - auVar83._8_4_ * fVar100) * fVar100;
      fVar101 = fVar101 + (1.0 - auVar83._12_4_ * fVar101) * fVar101;
      fVar102 = fVar102 + (1.0 - auVar88._0_4_) * fVar102;
      fVar103 = fVar103 + (1.0 - auVar88._4_4_) * fVar103;
      fVar104 = fVar104 + (1.0 - auVar88._8_4_) * fVar104;
      fVar105 = fVar105 + (1.0 - auVar88._12_4_) * fVar105;
      fVar86 = fVar86 + (1.0 - auVar93._0_4_ * fVar86) * fVar86;
      fVar89 = fVar89 + (1.0 - auVar93._4_4_ * fVar89) * fVar89;
      fVar90 = fVar90 + (1.0 - auVar93._8_4_ * fVar90) * fVar90;
      fVar91 = fVar91 + (1.0 - auVar93._12_4_ * fVar91) * fVar91;
      auVar48 = maxps(auVar2,ZEXT816(0));
      auVar55 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,ZEXT816(0));
      iVar13 = (int)DAT_01f45a30;
      iVar106 = DAT_01f45a30._4_4_;
      iVar107 = DAT_01f45a30._8_4_;
      iVar108 = DAT_01f45a30._12_4_;
      local_16f8.v = (__m128)blendvps(_DAT_01f45a30,auVar48,auVar32);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01f45a40,auVar55,auVar32);
      pNVar18 = stack_node + 2;
      paVar19 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = local_16f8;
      local_1708 = fVar97;
      fStack_1704 = fVar99;
      fStack_1700 = fVar100;
      fStack_16fc = fVar101;
      local_1718 = fVar102;
      fStack_1714 = fVar103;
      fStack_1710 = fVar104;
      fStack_170c = fVar105;
      local_1728 = fVar86;
      fStack_1724 = fVar89;
      fStack_1720 = fVar90;
      fStack_171c = fVar91;
      local_1738 = fVar92;
      fStack_1734 = fVar94;
      fStack_1730 = fVar95;
      fStack_172c = fVar96;
      local_1748 = fVar73;
      fStack_1744 = fVar76;
      fStack_1740 = fVar84;
      fStack_173c = fVar85;
      local_1758 = fVar59;
      fStack_1754 = fVar61;
      fStack_1750 = fVar64;
      fStack_174c = fVar67;
LAB_006d9568:
      uVar14 = auVar109._8_8_;
      pNVar1 = pNVar18 + -1;
      if ((RayQueryContext *)pNVar1->ptr != (RayQueryContext *)0xfffffffffffffff8) {
        pNVar18 = pNVar18 + -1;
        aVar33 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19[-1].v;
        paVar19 = paVar19 + -1;
        auVar22._4_4_ = -(uint)(aVar33.v[1] < (float)bi_8.field_0.i[1]);
        auVar22._0_4_ = -(uint)(aVar33.v[0] < (float)bi_8.field_0.i[0]);
        auVar22._8_4_ = -(uint)(aVar33.v[2] < (float)bi_8.field_0.i[2]);
        auVar22._12_4_ = -(uint)(aVar33._12_4_ < (float)bi_8.field_0.i[3]);
        uVar6 = movmskps(auVar109._0_4_,auVar22);
        pRVar7 = (RayQueryContext *)CONCAT44(0,uVar6);
        auVar109._8_8_ = uVar14;
        auVar109._0_8_ = (ulong)pRVar7;
        pRVar20 = (RayQueryContext *)pNVar1->ptr;
        if (uVar6 != 0) {
          while (((ulong)pRVar20 & 8) == 0) {
            uVar14 = (ulong)pRVar20 & 0xfffffffffffffff0;
            aVar33.i[1] = iVar106;
            aVar33.i[0] = iVar13;
            aVar33.i[2] = iVar107;
            aVar33.i[3] = iVar108;
            uVar12 = 0;
            pRVar7 = (RayQueryContext *)0x8;
            for (lVar15 = 0;
                (auVar109._8_8_ = uVar14, auVar109._0_8_ = (ulong)pRVar7, lVar15 != 4 &&
                (pRVar17 = *(RayQueryContext **)(uVar14 + lVar15 * 8),
                pRVar17 != (RayQueryContext *)0x8)); lVar15 = lVar15 + 1) {
              fVar78 = *(float *)((long)&pRVar20[1].user + lVar15 * 4);
              fVar81 = *(float *)((long)&pRVar20[2].scene + lVar15 * 4);
              fVar21 = *(float *)((long)&pRVar20[2].args + lVar15 * 4);
              fVar41 = *(float *)((long)&pRVar20[3].user + lVar15 * 4);
              fVar42 = (fVar78 - fVar92) * fVar97;
              fVar44 = (fVar78 - fVar94) * fVar99;
              fVar45 = (fVar78 - fVar95) * fVar100;
              fVar46 = (fVar78 - fVar96) * fVar101;
              fVar47 = (fVar21 - fVar73) * fVar102;
              fVar50 = (fVar21 - fVar76) * fVar103;
              fVar51 = (fVar21 - fVar84) * fVar104;
              fVar52 = (fVar21 - fVar85) * fVar105;
              fVar78 = *(float *)((long)&pRVar20[4].scene + lVar15 * 4);
              fVar53 = (fVar78 - fVar59) * fVar86;
              fVar56 = (fVar78 - fVar61) * fVar89;
              fVar57 = (fVar78 - fVar64) * fVar90;
              fVar58 = (fVar78 - fVar67) * fVar91;
              fVar21 = (fVar81 - fVar92) * fVar97;
              fVar30 = (fVar81 - fVar94) * fVar99;
              fVar31 = (fVar81 - fVar95) * fVar100;
              fVar81 = (fVar81 - fVar96) * fVar101;
              fVar34 = (fVar41 - fVar73) * fVar102;
              fVar39 = (fVar41 - fVar76) * fVar103;
              fVar40 = (fVar41 - fVar84) * fVar104;
              fVar41 = (fVar41 - fVar85) * fVar105;
              fVar78 = *(float *)((long)&pRVar20[4].args + lVar15 * 4);
              fVar70 = (fVar78 - fVar59) * fVar86;
              fVar74 = (fVar78 - fVar61) * fVar89;
              fVar75 = (fVar78 - fVar64) * fVar90;
              fVar78 = (fVar78 - fVar67) * fVar91;
              uVar6 = (uint)((int)fVar21 < (int)fVar42) * (int)fVar21 |
                      (uint)((int)fVar21 >= (int)fVar42) * (int)fVar42;
              uVar62 = (uint)((int)fVar30 < (int)fVar44) * (int)fVar30 |
                       (uint)((int)fVar30 >= (int)fVar44) * (int)fVar44;
              uVar65 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar31 |
                       (uint)((int)fVar31 >= (int)fVar45) * (int)fVar45;
              uVar68 = (uint)((int)fVar81 < (int)fVar46) * (int)fVar81 |
                       (uint)((int)fVar81 >= (int)fVar46) * (int)fVar46;
              uVar77 = (uint)((int)fVar34 < (int)fVar47) * (int)fVar34 |
                       (uint)((int)fVar34 >= (int)fVar47) * (int)fVar47;
              uVar79 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar39 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar50;
              uVar80 = (uint)((int)fVar40 < (int)fVar51) * (int)fVar40 |
                       (uint)((int)fVar40 >= (int)fVar51) * (int)fVar51;
              uVar82 = (uint)((int)fVar41 < (int)fVar52) * (int)fVar41 |
                       (uint)((int)fVar41 >= (int)fVar52) * (int)fVar52;
              uVar77 = ((int)uVar77 < (int)uVar6) * uVar6 | ((int)uVar77 >= (int)uVar6) * uVar77;
              uVar79 = ((int)uVar79 < (int)uVar62) * uVar62 | ((int)uVar79 >= (int)uVar62) * uVar79;
              uVar80 = ((int)uVar80 < (int)uVar65) * uVar65 | ((int)uVar80 >= (int)uVar65) * uVar80;
              uVar82 = ((int)uVar82 < (int)uVar68) * uVar68 | ((int)uVar82 >= (int)uVar68) * uVar82;
              uVar6 = (uint)((int)fVar70 < (int)fVar53) * (int)fVar70 |
                      (uint)((int)fVar70 >= (int)fVar53) * (int)fVar53;
              uVar62 = (uint)((int)fVar74 < (int)fVar56) * (int)fVar74 |
                       (uint)((int)fVar74 >= (int)fVar56) * (int)fVar56;
              uVar65 = (uint)((int)fVar75 < (int)fVar57) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar57) * (int)fVar57;
              uVar68 = (uint)((int)fVar78 < (int)fVar58) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar58) * (int)fVar58;
              uVar60 = ((int)uVar6 < (int)uVar77) * uVar77 | ((int)uVar6 >= (int)uVar77) * uVar6;
              uVar63 = ((int)uVar62 < (int)uVar79) * uVar79 | ((int)uVar62 >= (int)uVar79) * uVar62;
              uVar66 = ((int)uVar65 < (int)uVar80) * uVar80 | ((int)uVar65 >= (int)uVar80) * uVar65;
              uVar69 = ((int)uVar68 < (int)uVar82) * uVar82 | ((int)uVar68 >= (int)uVar82) * uVar68;
              uVar6 = (uint)((int)fVar21 < (int)fVar42) * (int)fVar42 |
                      (uint)((int)fVar21 >= (int)fVar42) * (int)fVar21;
              uVar62 = (uint)((int)fVar30 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar30 >= (int)fVar44) * (int)fVar30;
              uVar65 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar45 |
                       (uint)((int)fVar31 >= (int)fVar45) * (int)fVar31;
              uVar68 = (uint)((int)fVar81 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar81 >= (int)fVar46) * (int)fVar81;
              uVar77 = (uint)((int)fVar34 < (int)fVar47) * (int)fVar47 |
                       (uint)((int)fVar34 >= (int)fVar47) * (int)fVar34;
              uVar79 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar39;
              uVar80 = (uint)((int)fVar40 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar40 >= (int)fVar51) * (int)fVar40;
              uVar82 = (uint)((int)fVar41 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar41 >= (int)fVar52) * (int)fVar41;
              uVar6 = ((int)uVar6 < (int)uVar77) * uVar6 | ((int)uVar6 >= (int)uVar77) * uVar77;
              uVar62 = ((int)uVar62 < (int)uVar79) * uVar62 | ((int)uVar62 >= (int)uVar79) * uVar79;
              uVar65 = ((int)uVar65 < (int)uVar80) * uVar65 | ((int)uVar65 >= (int)uVar80) * uVar80;
              uVar68 = ((int)uVar68 < (int)uVar82) * uVar68 | ((int)uVar68 >= (int)uVar82) * uVar82;
              uVar77 = (uint)((int)fVar70 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar70 >= (int)fVar53) * (int)fVar70;
              uVar79 = (uint)((int)fVar74 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar74 >= (int)fVar56) * (int)fVar74;
              uVar80 = (uint)((int)fVar75 < (int)fVar57) * (int)fVar57 |
                       (uint)((int)fVar75 >= (int)fVar57) * (int)fVar75;
              uVar82 = (uint)((int)fVar78 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar78 >= (int)fVar58) * (int)fVar78;
              uVar77 = (uint)(bi_8.field_0.i[0] < (int)uVar77) * bi_8.field_0.i[0] |
                       (bi_8.field_0.i[0] >= (int)uVar77) * uVar77;
              uVar79 = (uint)(bi_8.field_0.i[1] < (int)uVar79) * bi_8.field_0.i[1] |
                       (bi_8.field_0.i[1] >= (int)uVar79) * uVar79;
              uVar80 = (uint)(bi_8.field_0.i[2] < (int)uVar80) * bi_8.field_0.i[2] |
                       (bi_8.field_0.i[2] >= (int)uVar80) * uVar80;
              uVar82 = (uint)(bi_8.field_0.i[3] < (int)uVar82) * bi_8.field_0.i[3] |
                       (bi_8.field_0.i[3] >= (int)uVar82) * uVar82;
              auVar23._4_4_ =
                   -(uint)((float)((uint)((int)uVar63 < (int)local_16f8._4_4_) * local_16f8._4_4_ |
                                  ((int)uVar63 >= (int)local_16f8._4_4_) * uVar63) <=
                          (float)(((int)uVar62 < (int)uVar79) * uVar62 |
                                 ((int)uVar62 >= (int)uVar79) * uVar79));
              auVar23._0_4_ =
                   -(uint)((float)((uint)((int)uVar60 < (int)local_16f8._0_4_) * local_16f8._0_4_ |
                                  ((int)uVar60 >= (int)local_16f8._0_4_) * uVar60) <=
                          (float)(((int)uVar6 < (int)uVar77) * uVar6 |
                                 ((int)uVar6 >= (int)uVar77) * uVar77));
              auVar23._8_4_ =
                   -(uint)((float)((uint)((int)uVar66 < (int)local_16f8._8_4_) * local_16f8._8_4_ |
                                  ((int)uVar66 >= (int)local_16f8._8_4_) * uVar66) <=
                          (float)(((int)uVar65 < (int)uVar80) * uVar65 |
                                 ((int)uVar65 >= (int)uVar80) * uVar80));
              auVar23._12_4_ =
                   -(uint)((float)((uint)((int)uVar69 < (int)local_16f8._12_4_) * local_16f8._12_4_
                                  | ((int)uVar69 >= (int)local_16f8._12_4_) * uVar69) <=
                          (float)(((int)uVar68 < (int)uVar82) * uVar68 |
                                 ((int)uVar68 >= (int)uVar82) * uVar82));
              uVar6 = movmskps((int)context,auVar23);
              pRVar8 = pRVar7;
              context = (RayQueryContext *)(ulong)uVar6;
              aVar36 = aVar33;
              if (uVar6 != 0) {
                auVar35._4_4_ = iVar106;
                auVar35._0_4_ = iVar13;
                auVar35._8_4_ = iVar107;
                auVar35._12_4_ = iVar108;
                auVar5._4_4_ = uVar63;
                auVar5._0_4_ = uVar60;
                auVar5._8_4_ = uVar66;
                auVar5._12_4_ = uVar69;
                aVar36 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps(auVar35,auVar5,auVar23);
                auVar24._4_4_ = -(uint)(aVar36.v[1] < aVar33.v[1]);
                auVar24._0_4_ = -(uint)(aVar36.v[0] < aVar33.v[0]);
                auVar24._8_4_ = -(uint)(aVar36.v[2] < aVar33.v[2]);
                auVar24._12_4_ = -(uint)(aVar36.v[3] < aVar33.v[3]);
                iVar16 = movmskps(uVar6,auVar24);
                aVar25 = aVar36;
                if ((iVar16 == 0) ||
                   (pRVar8 = pRVar17, pRVar17 = pRVar7, context = pRVar7, aVar25 = aVar33,
                   aVar33 = aVar36, pRVar7 != (RayQueryContext *)0x8)) {
                  aVar36 = aVar33;
                  uVar12 = uVar12 + 1;
                  pNVar18->ptr = (size_t)pRVar17;
                  pNVar18 = pNVar18 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v = aVar25;
                  paVar19 = paVar19 + 1;
                  context = pRVar17;
                }
              }
              pRVar7 = pRVar8;
              aVar33 = aVar36;
            }
            if (pRVar7 == (RayQueryContext *)0x8) goto LAB_006d9568;
            pRVar20 = pRVar7;
            if (1 < uVar12) {
              auVar48 = *(undefined1 (*) [16])paVar19[-2].v;
              auVar55 = *(undefined1 (*) [16])paVar19[-1].v;
              auVar37._4_4_ = -(uint)(auVar48._4_4_ < auVar55._4_4_);
              auVar37._0_4_ = -(uint)(auVar48._0_4_ < auVar55._0_4_);
              auVar37._8_4_ = -(uint)(auVar48._8_4_ < auVar55._8_4_);
              auVar37._12_4_ = -(uint)(auVar48._12_4_ < auVar55._12_4_);
              uVar6 = movmskps((int)uVar14,auVar37);
              uVar14 = (ulong)uVar6;
              auVar26 = auVar55;
              if (uVar6 != 0) {
                *(undefined1 (*) [16])paVar19[-2].v = auVar55;
                *(undefined1 (*) [16])paVar19[-1].v = auVar48;
                auVar26 = *(undefined1 (*) [16])(pNVar18 + -2);
                auVar38._0_8_ = auVar26._8_8_;
                auVar38._8_4_ = auVar26._0_4_;
                auVar38._12_4_ = auVar26._4_4_;
                *(undefined1 (*) [16])(pNVar18 + -2) = auVar38;
                auVar26 = auVar48;
                auVar48 = auVar55;
              }
              if (uVar12 != 2) {
                auVar55 = *(undefined1 (*) [16])paVar19[-3].v;
                auVar49._4_4_ = -(uint)(auVar55._4_4_ < auVar26._4_4_);
                auVar49._0_4_ = -(uint)(auVar55._0_4_ < auVar26._0_4_);
                auVar49._8_4_ = -(uint)(auVar55._8_4_ < auVar26._8_4_);
                auVar49._12_4_ = -(uint)(auVar55._12_4_ < auVar26._12_4_);
                uVar6 = movmskps(uVar6,auVar49);
                uVar14 = (ulong)uVar6;
                if (uVar6 != 0) {
                  *(undefined1 (*) [16])paVar19[-3].v = auVar26;
                  *(undefined1 (*) [16])paVar19[-1].v = auVar55;
                  sVar4 = pNVar18[-3].ptr;
                  uVar14 = pNVar18[-1].ptr;
                  pNVar18[-3].ptr = uVar14;
                  pNVar18[-1].ptr = sVar4;
                  auVar55 = auVar26;
                }
                auVar43._4_4_ = -(uint)(auVar55._4_4_ < auVar48._4_4_);
                auVar43._0_4_ = -(uint)(auVar55._0_4_ < auVar48._0_4_);
                auVar43._8_4_ = -(uint)(auVar55._8_4_ < auVar48._8_4_);
                auVar43._12_4_ = -(uint)(auVar55._12_4_ < auVar48._12_4_);
                uVar6 = movmskps((int)uVar14,auVar43);
                uVar14 = (ulong)uVar6;
                if (uVar6 != 0) {
                  *(undefined1 (*) [16])paVar19[-3].v = auVar48;
                  *(undefined1 (*) [16])paVar19[-2].v = auVar55;
                  auVar48 = *(undefined1 (*) [16])(pNVar18 + -3);
                  auVar27._0_8_ = auVar48._8_8_;
                  auVar27._8_4_ = auVar48._0_4_;
                  auVar27._12_4_ = auVar48._4_4_;
                  *(undefined1 (*) [16])(pNVar18 + -3) = auVar27;
                }
              }
            }
          }
          if (pRVar20 == (RayQueryContext *)&DAT_fffffffffffffff8) {
            return;
          }
          auVar28._4_4_ = -(uint)(aVar33.v[1] < (float)bi_8.field_0.i[1]);
          auVar28._0_4_ = -(uint)(aVar33.v[0] < (float)bi_8.field_0.i[0]);
          auVar28._8_4_ = -(uint)(aVar33.v[2] < (float)bi_8.field_0.i[2]);
          auVar28._12_4_ = -(uint)(aVar33.v[3] < (float)bi_8.field_0.i[3]);
          uVar6 = movmskps((int)pRVar7,auVar28);
          auVar109._4_4_ = 0;
          auVar109._0_4_ = uVar6;
          auVar109._8_8_ = uVar14;
          if (uVar6 != 0) {
            lVar9 = (ulong)((uint)pRVar20 & 0xf) - 8;
            auVar109._0_8_ = lVar9;
            for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 1) {
              local_1774 = *(uint *)(((ulong)pRVar20 & 0xfffffffffffffff0) + lVar15 * 8);
              local_1770 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_1774 * 8);
              uVar6 = *(uint *)(local_1770 + 0x34);
              auVar29._0_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).occluded) == 0);
              auVar29._4_4_ =
                   -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
              auVar29._8_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).name) == 0);
              auVar29._12_4_ =
                   -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
              mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar29 & auVar28);
              iVar16 = movmskps(auVar109._8_4_,(undefined1  [16])mask.field_0);
              auVar109._8_4_ = iVar16;
              auVar109._0_8_ = local_1770;
              auVar109._12_4_ = 0;
              if (iVar16 != 0) {
                local_1790 = *(undefined4 *)(((ulong)pRVar20 & 0xfffffffffffffff0) + 4 + lVar15 * 8)
                ;
                local_17a0 = &mask;
                local_1798 = *(undefined8 *)(local_1770 + 0x18);
                local_1788 = *(undefined8 *)(ray + 8);
                local_1778 = 4;
                local_1768 = 0;
                local_1760 = *(long *)(ray + 0x10);
                pcVar10 = *(code **)(local_1760 + 0x18);
                if (pcVar10 == (code *)0x0) {
                  pcVar10 = *(code **)(local_1770 + 0x60);
                }
                local_1780 = This;
                auVar109 = (*pcVar10)(&local_17a0);
                iVar13 = 0x7f800000;
                iVar106 = 0x7f800000;
                iVar107 = 0x7f800000;
                iVar108 = 0x7f800000;
                fVar59 = local_1758;
                fVar61 = fStack_1754;
                fVar64 = fStack_1750;
                fVar67 = fStack_174c;
                fVar73 = local_1748;
                fVar76 = fStack_1744;
                fVar84 = fStack_1740;
                fVar85 = fStack_173c;
                fVar86 = local_1728;
                fVar89 = fStack_1724;
                fVar90 = fStack_1720;
                fVar91 = fStack_171c;
                fVar92 = local_1738;
                fVar94 = fStack_1734;
                fVar95 = fStack_1730;
                fVar96 = fStack_172c;
                fVar97 = local_1708;
                fVar99 = fStack_1704;
                fVar100 = fStack_1700;
                fVar101 = fStack_16fc;
                fVar102 = local_1718;
                fVar103 = fStack_1714;
                fVar104 = fStack_1710;
                fVar105 = fStack_170c;
              }
            }
            bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                           blendvps((undefined1  [16])bi_8.field_0,
                                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                    auVar28);
          }
        }
        goto LAB_006d9568;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }